

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlCatalogGetDefaults(void)

{
  int iVar1;
  xmlCatalogAllow val;
  int iVar2;
  int iVar3;
  xmlCatalogAllow ret_val;
  int mem_base;
  int test_ret;
  
  iVar1 = xmlMemBlocks();
  val = xmlCatalogGetDefaults();
  desret_xmlCatalogAllow(val);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar2 = xmlMemBlocks();
  if (iVar1 != iVar2) {
    iVar3 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlCatalogGetDefaults",(ulong)(uint)(iVar3 - iVar1));
    printf("\n");
  }
  ret_val = (xmlCatalogAllow)(iVar1 != iVar2);
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlCatalogGetDefaults(void) {
    int test_ret = 0;

#if defined(LIBXML_CATALOG_ENABLED)
    int mem_base;
    xmlCatalogAllow ret_val;

        mem_base = xmlMemBlocks();

        ret_val = xmlCatalogGetDefaults();
        desret_xmlCatalogAllow(ret_val);
        call_tests++;
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlCatalogGetDefaults",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf("\n");
        }
    function_tests++;
#endif

    return(test_ret);
}